

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.cpp
# Opt level: O2

optional<pbrt::SquareMatrix<3>_> * __thiscall
pbrt::PixelSensor::SolveXYZFromSensorRGB
          (optional<pbrt::SquareMatrix<3>_> *__return_storage_ptr__,PixelSensor *this,
          SpectrumHandle *sensorIllum,SpectrumHandle *outputIllum)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  SpectrumHandle *pSVar3;
  optional<pbrt::SquareMatrix<3>_> *poVar4;
  int c;
  long lVar5;
  ulong uVar6;
  Float *pFVar7;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  TVar8;
  size_t i_1;
  size_t i;
  ulong uVar9;
  Float FVar10;
  Float FVar11;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  float fVar12;
  RGB RVar13;
  XYZ XVar14;
  Float xyzOutput [24] [3];
  Float rgbCamera [24] [3];
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  local_300;
  SpectrumHandle *local_2f8;
  optional<pbrt::SquareMatrix<3>_> *local_2f0;
  SpectrumHandle local_2e8;
  SpectrumHandle local_2e0;
  SpectrumHandle local_2d8;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  local_2d0;
  SpectrumHandle local_2c8;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  local_2c0;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  local_2b8;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  local_2b0;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  local_2a8;
  SpectrumHandle local_2a0;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  local_298;
  SpectrumHandle local_290;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  local_288;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  local_280;
  Float local_278 [72];
  Float local_158 [74];
  
  local_280.bits =
       (outputIllum->
       super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
       ).bits;
  local_2f8 = outputIllum;
  local_2f0 = __return_storage_ptr__;
  IlluminantToSensorRGB(this,(SpectrumHandle *)&local_280);
  pFVar7 = local_158;
  TVar8.bits = (ulong)&this->g_bar | 0x2000000000000;
  for (uVar9 = 0; uVar9 < (ulong)(DAT_03056690 - swatchReflectances >> 3); uVar9 = uVar9 + 1) {
    local_300.bits = *(uintptr_t *)(swatchReflectances + uVar9 * 8);
    local_2a8.bits =
         (sensorIllum->
         super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
         ).bits;
    local_2c0.bits = (ulong)&this->b_bar | 0x2000000000000;
    local_2b8.bits = TVar8.bits;
    local_2b0.bits = (ulong)&this->r_bar | 0x2000000000000;
    RVar13 = ProjectReflectance<pbrt::RGB>
                       ((SpectrumHandle *)&local_300,(SpectrumHandle *)&local_2a8,
                        (SpectrumHandle *)&local_2b0,(SpectrumHandle *)&local_2b8,
                        (SpectrumHandle *)&local_2c0);
    auVar2._8_8_ = extraout_XMM0_Qb;
    auVar2._0_8_ = RVar13._0_8_;
    auVar1 = vmovshdup_avx(auVar2);
    for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
      FVar10 = RVar13.r;
      if (((int)lVar5 != 0) && (FVar10 = auVar1._0_4_, (int)lVar5 != 1)) {
        FVar10 = RVar13.b;
      }
      pFVar7[lVar5] = FVar10;
    }
    pFVar7 = pFVar7 + 3;
  }
  local_288.bits =
       (sensorIllum->
       super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
       ).bits;
  local_290.
  super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
           )(TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
             )TVar8.bits;
  FVar10 = InnerProduct((SpectrumHandle *)&local_288,&local_290);
  local_298.bits =
       (sensorIllum->
       super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
       ).bits;
  local_2a0.
  super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
           )(Spectra::y | 0x2000000000000);
  FVar11 = InnerProduct((SpectrumHandle *)&local_298,&local_2a0);
  pSVar3 = local_2f8;
  pFVar7 = local_278;
  uVar9 = 0;
  while( true ) {
    poVar4 = local_2f0;
    uVar6 = DAT_03056690 - swatchReflectances >> 3;
    if (uVar6 <= uVar9) break;
    local_2c8.
    super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
    .bits = *(TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
              *)(swatchReflectances + uVar9 * 8);
    local_2d0.bits =
         (pSVar3->
         super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
         ).bits;
    local_2d8.
    super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
    .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
             )(Spectra::x | 0x2000000000000);
    local_2e0.
    super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
    .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
             )(Spectra::y | 0x2000000000000);
    local_2e8.
    super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
    .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
             )(Spectra::z | 0x2000000000000);
    XVar14 = ProjectReflectance<pbrt::XYZ>
                       (&local_2c8,(SpectrumHandle *)&local_2d0,&local_2d8,&local_2e0,&local_2e8);
    auVar1._8_8_ = extraout_XMM0_Qb_00;
    auVar1._0_8_ = XVar14._0_8_;
    auVar1 = vmovshdup_avx(auVar1);
    for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
      fVar12 = XVar14.X;
      if (((int)lVar5 != 0) && (fVar12 = auVar1._0_4_, (int)lVar5 != 1)) {
        fVar12 = XVar14.Z;
      }
      pFVar7[lVar5] = (FVar11 / FVar10) * fVar12;
    }
    uVar9 = uVar9 + 1;
    pFVar7 = pFVar7 + 3;
  }
  LinearLeastSquares(local_2f0,(Float (*) [3])local_158,(Float (*) [3])local_278,(int)uVar6);
  return poVar4;
}

Assistant:

pstd::optional<SquareMatrix<3>> PixelSensor::SolveXYZFromSensorRGB(
    SpectrumHandle sensorIllum, SpectrumHandle outputIllum) const {
    Float rgbCamera[24][3], xyzOutput[24][3];
    // Compute _rgbCamera_ values for training swatches
    RGB outputWhite = IlluminantToSensorRGB(outputIllum);
    for (size_t i = 0; i < swatchReflectances.size(); ++i) {
        RGB rgb = ProjectReflectance<RGB>(swatchReflectances[i], sensorIllum, &r_bar,
                                          &g_bar, &b_bar);
        for (int c = 0; c < 3; ++c)
            rgbCamera[i][c] = rgb[c];
    }

    // Compute _xyzOutput_ values for training swatches
    Float sensorWhiteG = InnerProduct(sensorIllum, &g_bar);
    Float sensorWhiteY = InnerProduct(sensorIllum, &Spectra::Y());
    for (size_t i = 0; i < swatchReflectances.size(); ++i) {
        SpectrumHandle s = swatchReflectances[i];
        XYZ xyz = ProjectReflectance<XYZ>(s, outputIllum, &Spectra::X(), &Spectra::Y(),
                                          &Spectra::Z()) *
                  (sensorWhiteY / sensorWhiteG);
        for (int c = 0; c < 3; ++c)
            xyzOutput[i][c] = xyz[c];
    }

    return LinearLeastSquares(rgbCamera, xyzOutput, swatchReflectances.size());
}